

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O1

MatrixFixSize<4U,_3U> * iDynTree::Rotation::QuaternionRightTrivializedDerivative(Vector4 quaternion)

{
  MatrixFixSize<4U,_3U> *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  *(undefined4 *)in_RDI->m_data = quaternion.m_data[1]._0_4_;
  *(uint *)((long)in_RDI->m_data + 4) = quaternion.m_data[1]._4_4_ ^ 0x80000000;
  *(undefined4 *)(in_RDI->m_data + 1) = quaternion.m_data[2]._0_4_;
  *(uint *)((long)in_RDI->m_data + 0xc) = quaternion.m_data[2]._4_4_ ^ 0x80000000;
  in_RDI->m_data[3] = 1.0;
  in_RDI->m_data[6] = 0.0;
  in_RDI->m_data[4] = 0.0;
  in_RDI->m_data[5] = 0.0;
  in_RDI->m_data[7] = 1.0;
  in_RDI->m_data[10] = 0.0;
  in_RDI->m_data[8] = 0.0;
  in_RDI->m_data[9] = 0.0;
  in_RDI->m_data[0xb] = 1.0;
  dVar1 = in_RDI->m_data[3] * quaternion.m_data[0];
  dVar2 = in_RDI->m_data[4] * quaternion.m_data[0];
  in_RDI->m_data[3] = dVar1;
  in_RDI->m_data[4] = dVar2;
  dVar3 = in_RDI->m_data[5] * quaternion.m_data[0];
  dVar4 = in_RDI->m_data[6] * quaternion.m_data[0];
  in_RDI->m_data[5] = dVar3;
  in_RDI->m_data[6] = dVar4;
  dVar5 = in_RDI->m_data[7] * quaternion.m_data[0];
  dVar6 = in_RDI->m_data[8] * quaternion.m_data[0];
  in_RDI->m_data[7] = dVar5;
  in_RDI->m_data[8] = dVar6;
  dVar7 = in_RDI->m_data[9] * quaternion.m_data[0];
  dVar8 = in_RDI->m_data[10] * quaternion.m_data[0];
  in_RDI->m_data[9] = dVar7;
  in_RDI->m_data[10] = dVar8;
  in_RDI->m_data[0xb] = quaternion.m_data[0];
  in_RDI->m_data[2] = -quaternion.m_data[3];
  in_RDI->m_data[3] = dVar1 - 0.0;
  in_RDI->m_data[4] = dVar2 - -quaternion.m_data[3];
  in_RDI->m_data[5] = dVar3 - quaternion.m_data[2];
  in_RDI->m_data[6] = dVar4 - quaternion.m_data[3];
  in_RDI->m_data[7] = dVar5 - 0.0;
  in_RDI->m_data[8] = dVar6 - -quaternion.m_data[1];
  in_RDI->m_data[9] = dVar7 - -quaternion.m_data[2];
  in_RDI->m_data[10] = dVar8 - quaternion.m_data[1];
  in_RDI->m_data[0xb] = quaternion.m_data[0];
  dVar1 = in_RDI->m_data[1];
  dVar2 = in_RDI->m_data[10];
  dVar3 = in_RDI->m_data[0xb];
  in_RDI->m_data[0] = in_RDI->m_data[0] * 0.5;
  in_RDI->m_data[1] = dVar1 * 0.5;
  in_RDI->m_data[2] = in_RDI->m_data[2] * 0.5;
  in_RDI->m_data[3] = in_RDI->m_data[3] * 0.5;
  in_RDI->m_data[4] = in_RDI->m_data[4] * 0.5;
  in_RDI->m_data[5] = in_RDI->m_data[5] * 0.5;
  in_RDI->m_data[6] = in_RDI->m_data[6] * 0.5;
  in_RDI->m_data[7] = in_RDI->m_data[7] * 0.5;
  in_RDI->m_data[8] = in_RDI->m_data[8] * 0.5;
  in_RDI->m_data[9] = in_RDI->m_data[9] * 0.5;
  in_RDI->m_data[10] = dVar2 * 0.5;
  in_RDI->m_data[0xb] = dVar3 * 0.5;
  return in_RDI;
}

Assistant:

MatrixFixSize<4, 3> Rotation::QuaternionRightTrivializedDerivative(Vector4 quaternion)
    {
        MatrixFixSize<4, 3> outputMatrix;
        Eigen::Map<Eigen::Matrix<double, 4, 3, Eigen::RowMajor> > map = iDynTree::toEigen(outputMatrix);
        map.topRows<1>() = -iDynTree::toEigen(quaternion).tail<3>().transpose();
        map.bottomRows<3>().setIdentity();
        map.bottomRows<3>() *= quaternion(0);
        map.bottomRows<3>() -= iDynTree::skew(iDynTree::toEigen(quaternion).tail<3>());
        map *= 0.5;
        return outputMatrix;
    }